

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.h
# Opt level: O0

void __thiscall dynamicgraph::TimeDependency<int>::~TimeDependency(TimeDependency<int> *this)

{
  TimeDependency<int> *this_local;
  
  ~TimeDependency(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~TimeDependency() {}